

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O0

bool __thiscall auto_array<short>::reserve(auto_array<short> *this,size_t new_capacity)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ulong in_RSI;
  long *in_RDI;
  short *new_data;
  short *in_stack_ffffffffffffffc8;
  short *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (in_RSI < (ulong)in_RDI[2]) {
    local_1 = false;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    if ((*in_RDI != 0) && (in_RDI[2] != 0)) {
      PodCopy<short>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1163a8);
    }
    in_RDI[1] = in_RSI;
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = (long)pvVar3;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool reserve(size_t new_capacity)
  {
    if (new_capacity < length_) {
      return false;
    }
    T * new_data = new T[new_capacity];
    if (data_ && length_) {
      PodCopy(new_data, data_, length_);
    }
    capacity_ = new_capacity;
    delete[] data_;
    data_ = new_data;

    return true;
  }